

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Entry * __thiscall
kj::Vector<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry>::
add<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry>
          (Vector<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry> *this,
          Entry *params)

{
  bool bVar1;
  Entry *pEVar2;
  Entry *params_local;
  Vector<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> *this_local;
  
  bVar1 = ArrayBuilder<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>
          ::isFull((ArrayBuilder<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>
                    *)this);
  if (bVar1) {
    Vector<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>::grow
              ((Vector<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>
                *)this,0);
  }
  pEVar2 = fwd<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry>(params);
  pEVar2 = ArrayBuilder<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry>
           ::add<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry>
                     ((ArrayBuilder<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry>
                       *)this,pEVar2);
  return pEVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }